

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

Task * AI::create_Browse(void)

{
  vector<AI::Task,_std::allocator<AI::Task>_> *this;
  pointer pTVar1;
  Task *in_RDI;
  int in_R8D;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  Vector3 debugSphereColour;
  Task selectStack;
  Task moveToDestination;
  Task wait;
  string local_aa0;
  Task local_a80;
  Task local_708;
  Task local_390;
  
  local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa0,"browse","");
  Task::Task(in_RDI,&local_aa0,Compound);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  Task::Task(&local_a80);
  local_a80.action = SelectDestination;
  local_708.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3f800000;
  if (local_a80.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_a80.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_a80.parameters.values,
               (iterator)
               local_a80.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl
               .super__Vector_impl_data._M_finish,(float *)&local_708);
  }
  else {
    *local_a80.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_finish = 1.0;
    local_a80.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a80.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  debugSphereColour.z = in_XMM2_Da;
  debugSphereColour.x = (float)(int)in_XMM1_Qa;
  debugSphereColour.y = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  create_MoveToDestination(&local_708,(AI *)0x1,70.0,debugSphereColour,1.0,true,true,in_R8D);
  create_Wait(&local_390,5.0);
  this = &in_RDI->subtasks;
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar1) {
    pTVar1[-1].isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_a80);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_708);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_390);
  (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].isLastInCompound = true;
  Task::~Task(&local_390);
  Task::~Task(&local_708);
  Task::~Task(&local_a80);
  return in_RDI;
}

Assistant:

Task create_Browse()
	{
		Task browse  {"browse", TaskType::Compound};
		Task selectStack;
		selectStack.action = Action::SelectDestination;
		selectStack.parameters.values.push_back(static_cast<float>(DestinationType::RandomStack));

		auto moveToDestination = create_MoveToDestination(70.f, {0.8f, 0.4f, 0.4f});
		auto wait = create_Wait(5.f);

		browse.addSubtask(selectStack);
		browse.addSubtask(moveToDestination);
		browse.addSubtask(wait);

		return browse;
	}